

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way<false,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  size_t __n;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  bool bVar5;
  unsigned_short uVar6;
  MergeResult MVar7;
  ostream *poVar8;
  ostream *poVar9;
  MergeResult MVar10;
  long lVar11;
  unsigned_short *puVar12;
  unsigned_short *cache_input0;
  ulong uVar13;
  size_t n_00;
  uchar **strings_output_00;
  lcp_t *plVar14;
  lcp_t *lcp_input0;
  uchar **ppuVar15;
  byte bVar16;
  byte bVar17;
  size_t i_1;
  lcp_t lVar18;
  lcp_t in_R11;
  ulong uVar19;
  char local_91;
  lcp_t *local_90;
  MergeResult local_84;
  unsigned_short *local_80;
  lcp_t *local_78;
  uchar **local_70;
  unsigned_short *local_68;
  uchar **local_60;
  unsigned_short *local_58;
  uchar **local_50;
  unsigned_short *local_48;
  lcp_t *local_40;
  ulong local_38;
  
  local_90 = lcp_output;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"mergesort_cache_lcp_2way",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(): n=",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  local_91 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_91,1);
  if (0x1f < n) {
    uVar19 = n >> 1;
    MVar7 = mergesort_cache_lcp_2way<true,unsigned_short>
                      (strings_input,strings_output,lcp_input,local_90,cache_input,cache_output,
                       uVar19);
    puVar12 = cache_input;
    plVar14 = lcp_input;
    ppuVar15 = strings_input;
    if (MVar7 != SortedInPlace) {
      puVar12 = cache_output;
      plVar14 = local_90;
      ppuVar15 = strings_output;
    }
    check_input<unsigned_short>(ppuVar15,plVar14,puVar12,uVar19);
    local_50 = strings_input + uVar19;
    strings_output_00 = strings_output + uVar19;
    plVar14 = lcp_input + uVar19;
    local_40 = local_90 + uVar19;
    local_48 = cache_input + uVar19;
    puVar12 = cache_output + uVar19;
    n_00 = n - uVar19;
    local_80 = cache_input;
    local_60 = strings_output;
    local_58 = cache_output;
    local_38 = uVar19;
    local_84 = mergesort_cache_lcp_2way<true,unsigned_short>
                         (local_50,strings_output_00,plVar14,local_40,local_48,puVar12,n_00);
    cache_input0 = local_48;
    lcp_input0 = plVar14;
    ppuVar15 = local_50;
    if (MVar7 != SortedInPlace) {
      cache_input0 = puVar12;
      lcp_input0 = local_40;
      ppuVar15 = strings_output_00;
    }
    local_78 = plVar14;
    local_70 = strings_output_00;
    local_68 = puVar12;
    check_input<unsigned_short>(ppuVar15,lcp_input0,cache_input0,n_00);
    uVar19 = local_38;
    plVar14 = local_90;
    MVar10 = local_84;
    if (MVar7 != local_84) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"Warning: extra copying due to m0 != m1. n=",0x2a);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      __n = uVar19 * 8;
      if (MVar7 == SortedInPlace) {
        memmove(local_60,strings_input,__n);
        memcpy(local_58,local_80,n & 0xfffffffffffffffe);
        plVar14 = local_90;
        memcpy(local_90,lcp_input,__n);
        MVar7 = SortedInTemp;
        MVar10 = local_84;
      }
      else {
        memmove(strings_input,local_60,__n);
        memcpy(local_80,local_58,n & 0xfffffffffffffffe);
        plVar14 = local_90;
        memcpy(lcp_input,local_90,__n);
        MVar10 = SortedInTemp;
      }
    }
    if (MVar7 == MVar10) {
      if (MVar7 == SortedInPlace) {
        merge_cache_lcp_2way<false,unsigned_short>
                  (strings_input,lcp_input,local_80,uVar19,local_50,local_78,local_48,n_00,local_60,
                   plVar14,local_58);
      }
      else {
        merge_cache_lcp_2way<false,unsigned_short>
                  (local_60,plVar14,local_58,uVar19,local_70,local_40,local_68,n_00,strings_input,
                   lcp_input,local_80);
      }
      return (uint)(MVar7 == SortedInPlace);
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned short]"
                 );
  }
  if (1 < (long)n) {
    uVar19 = n & 0xffffffff;
    poVar9 = (ostream *)strings_input;
    do {
      iVar4 = (int)uVar19;
      uVar19 = (ulong)(iVar4 - 1);
      pbVar1 = *(byte **)(poVar9 + 8);
      poVar9 = poVar9 + 8;
      for (poVar8 = poVar9; strings_input < poVar8; poVar8 = poVar8 + -8) {
        pbVar2 = *(byte **)(poVar8 + -8);
        bVar16 = *pbVar2;
        bVar17 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar16 != bVar17);
        if (bVar16 != 0 && bVar16 == bVar17) {
          in_R11 = 1;
          do {
            bVar16 = pbVar2[in_R11];
            bVar17 = pbVar1[in_R11];
            if (bVar16 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar16 == bVar17);
        }
        if (bVar16 <= bVar17) break;
        *(byte **)poVar8 = pbVar2;
      }
      *(byte **)poVar8 = pbVar1;
    } while (2 < iVar4);
  }
  puVar3 = *strings_input;
  lVar11 = 0;
  poVar9 = (ostream *)0x0;
  do {
    if ((puVar3[lVar11] == '\0') || (puVar3[lVar11] != strings_input[1][lVar11])) {
      bVar5 = false;
      poVar8 = poVar9;
    }
    else {
      poVar9 = poVar9 + 1;
      bVar5 = true;
    }
    lVar11 = lVar11 + 1;
  } while (bVar5);
  *lcp_input = (lcp_t)poVar8;
  if (puVar3 != (uchar *)0x0) {
    if (*puVar3 == '\0') {
      uVar6 = 0;
    }
    else {
      uVar6 = CONCAT11(*puVar3,puVar3[1]);
    }
    *cache_input = uVar6;
    if (1 < n - 1) {
      uVar19 = 1;
      do {
        puVar3 = strings_input[uVar19];
        uVar13 = (ulong)((int)uVar19 + 1);
        lVar11 = 0;
        lVar18 = 0;
        do {
          if ((puVar3[lVar11] == '\0') || (puVar3[lVar11] != strings_input[uVar13][lVar11])) {
            bVar5 = false;
            in_R11 = lVar18;
          }
          else {
            lVar18 = lVar18 + 1;
            bVar5 = true;
          }
          lVar11 = lVar11 + 1;
        } while (bVar5);
        lcp_input[uVar19] = in_R11;
        if (puVar3 == (uchar *)0x0) goto LAB_00245b0b;
        if (puVar3[lcp_input[(int)uVar19 - 1]] == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = CONCAT11(puVar3[lcp_input[(int)uVar19 - 1]],puVar3[lcp_input[(int)uVar19 - 1] + 1]
                          );
        }
        cache_input[uVar19] = uVar6;
        uVar19 = uVar13;
      } while (uVar13 < n - 1);
    }
    puVar3 = strings_input[n - 1];
    if (puVar3 != (uchar *)0x0) {
      if (puVar3[lcp_input[n - 2]] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = CONCAT11(puVar3[lcp_input[n - 2]],puVar3[lcp_input[n - 2] + 1]);
      }
      cache_input[n - 1] = uVar6;
      check_input<unsigned_short>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_00245b0b:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}